

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O0

void __thiscall mario::TcpClient::removeConnection(TcpClient *this,TcpConnectionPtr *conn)

{
  EventLoop *this_00;
  Writer *pWVar1;
  element_type *peVar2;
  InetAddress local_120 [2];
  TcpClient *local_100;
  Writer local_f8;
  code *local_70;
  undefined8 local_68;
  type local_60;
  Functor local_40;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  TcpConnectionPtr *conn_local;
  TcpClient *this_local;
  
  lock._mutex = (MutexLock *)conn;
  EventLoop::assertInLoopThread(this->_loop);
  MutexLockGuard::MutexLockGuard(&local_20,&this->_mutex);
  std::__shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->_connection).
              super___shared_ptr<mario::TcpConnection,_(__gnu_cxx::_Lock_policy)2>);
  MutexLockGuard::~MutexLockGuard(&local_20);
  this_00 = this->_loop;
  local_70 = TcpConnection::connectDestroyed;
  local_68 = 0;
  std::bind<void(mario::TcpConnection::*)(),std::shared_ptr<mario::TcpConnection>const&>
            (&local_60,(offset_in_TcpConnection_to_subr *)&local_70,
             (shared_ptr<mario::TcpConnection> *)lock._mutex);
  std::function<void()>::
  function<std::_Bind<void(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>,void>
            ((function<void()> *)&local_40,&local_60);
  EventLoop::queueInLoop(this_00,&local_40);
  std::function<void_()>::~function(&local_40);
  std::_Bind<void_(mario::TcpConnection::*(std::shared_ptr<mario::TcpConnection>))()>::~_Bind
            (&local_60);
  if (((this->_retry & 1U) != 0) && ((this->_connect & 1U) != 0)) {
    el::base::Writer::Writer
              (&local_f8,Info,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TcpClient.cpp"
               ,0x76,"void mario::TcpClient::removeConnection(const TcpConnectionPtr &)",NormalLog,0
              );
    pWVar1 = el::base::Writer::construct(&local_f8,1,el::base::consts::kDefaultLoggerId);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [21])"TcpClient::connect [");
    local_100 = this;
    pWVar1 = el::base::Writer::operator<<(pWVar1,&local_100);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [21])"] - Reconnecting to ");
    peVar2 = std::__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_connector);
    Connector::serverAddress(peVar2);
    InetAddress::toHostPort_abi_cxx11_(local_120);
    el::base::Writer::operator<<
              (pWVar1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
              );
    std::__cxx11::string::~string((string *)local_120);
    el::base::Writer::~Writer(&local_f8);
    peVar2 = std::__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mario::Connector,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->_connector);
    Connector::restart(peVar2);
  }
  return;
}

Assistant:

void TcpClient::removeConnection(const TcpConnectionPtr& conn) {
    _loop->assertInLoopThread();
    {
        MutexLockGuard lock(_mutex);
        _connection.reset();
    }
    _loop->queueInLoop(
            std::bind(&TcpConnection::connectDestroyed, conn)
            );
    if (_retry && _connect) {
        LOG(INFO) << "TcpClient::connect [" << this << "] - Reconnecting to "
            << _connector->serverAddress().toHostPort();
        _connector->restart();
    }
}